

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe46At0(uint8_t *buf)

{
  return (ulong)(buf[5] >> 2) |
         (ulong)((uint)buf[4] << 6 | (uint)buf[3] << 0xe) |
         ((ulong)buf[2] | (ulong)((uint)buf[1] << 8 | (uint)*buf << 0x10)) << 0x16;
}

Assistant:

std::uint64_t readFlUIntBe46At0(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[4];
    res <<= 6;
    res |= (buf[5] >> 2);
    res &= UINT64_C(0x3fffffffffff);
    return res;
}